

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int pythonDbusPresent(void)

{
  int iVar1;
  char *pcVar2;
  bool local_20a;
  byte local_209;
  undefined1 local_208 [8];
  char lPythonParams [256];
  char lPythonCommand [256];
  
  memcpy(local_208,
         "-c \"try:\n\timport dbus;bus=dbus.SessionBus();notif=bus.get_object(\'org.freedesktop.Notifications\',\'/org/freedesktop/Notifications\');notify=dbus.Interface(notif,\'org.freedesktop.Notifications\');\nexcept:\n\tprint(0);\""
         ,0x100);
  if (pythonDbusPresent::lDbusPresent < 0) {
    pythonDbusPresent::lDbusPresent = 0;
    iVar1 = python2Present();
    if (iVar1 != 0) {
      strcpy(gPythonName,gPython2Name);
      sprintf(lPythonParams + 0xf8,"%s %s",gPythonName,local_208);
      pythonDbusPresent::lDbusPresent = tryCommand(lPythonParams + 0xf8);
    }
    if ((pythonDbusPresent::lDbusPresent == 0) && (iVar1 = python3Present(), iVar1 != 0)) {
      strcpy(gPythonName,gPython3Name);
      sprintf(lPythonParams + 0xf8,"%s %s",gPythonName,local_208);
      pythonDbusPresent::lDbusPresent = tryCommand(lPythonParams + 0xf8);
    }
    if (tinyfd_verbose != 0) {
      printf("lDbusPresent %d\n",(ulong)(uint)pythonDbusPresent::lDbusPresent);
    }
    if (tinyfd_verbose != 0) {
      printf("gPythonName %s\n",gPythonName);
    }
  }
  local_209 = 0;
  if (pythonDbusPresent::lDbusPresent != 0) {
    iVar1 = graphicMode();
    local_209 = 0;
    if (iVar1 != 0) {
      iVar1 = isDarwin();
      local_20a = false;
      if (iVar1 != 0) {
        pcVar2 = getenv("SSH_TTY");
        local_20a = pcVar2 != (char *)0x0;
      }
      local_209 = local_20a ^ 0xff;
    }
  }
  return (int)(local_209 & 1);
}

Assistant:

static int pythonDbusPresent( )
{
    static int lDbusPresent = -1 ;
        char lPythonCommand[256];
        char lPythonParams[256] =
"-c \"try:\n\timport dbus;bus=dbus.SessionBus();\
notif=bus.get_object('org.freedesktop.Notifications','/org/freedesktop/Notifications');\
notify=dbus.Interface(notif,'org.freedesktop.Notifications');\nexcept:\n\tprint(0);\"";

        if ( lDbusPresent < 0 )
        {
                lDbusPresent = 0 ;
                if ( python2Present() )
                {
                        strcpy(gPythonName , gPython2Name ) ;
                        sprintf( lPythonCommand , "%s %s" , gPythonName , lPythonParams ) ;
                        lDbusPresent = tryCommand(lPythonCommand) ;
                }

                if ( ! lDbusPresent && python3Present() )
                {
                        strcpy(gPythonName , gPython3Name ) ;
                        sprintf( lPythonCommand , "%s %s" , gPythonName , lPythonParams ) ;
                        lDbusPresent = tryCommand(lPythonCommand) ;
                }

                if (tinyfd_verbose) printf("lDbusPresent %d\n", lDbusPresent) ;
                if (tinyfd_verbose) printf("gPythonName %s\n", gPythonName) ;
        }
        return lDbusPresent && graphicMode() && !(isDarwin() && getenv("SSH_TTY") );
}